

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

Vec_Int_t * Acec_RewriteTop(Gia_Man_t *p,Acec_Box_t *pBox)

{
  Vec_Wec_t *p_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar4;
  int i;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int Out [2];
  int In [3];
  
  p_01 = Vec_IntAlloc(p->vCos->nSize + 1);
  pObj = Gia_ManCo(p,0);
  iVar1 = Gia_ObjFaninId0p(p,pObj);
  for (i = 0; i < pBox->vRootLits->nSize; i = i + 1) {
    pVVar4 = Vec_WecEntry(pBox->vRootLits,i);
    iVar2 = Vec_IntEntry(pVVar4,0);
    iVar2 = Abc_Lit2Var(iVar2);
    if (iVar2 == iVar1) break;
  }
  if (p->vCos->nSize <= i) {
    __assert_fail("iStart < Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x167,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
  }
  uVar5 = 0;
  while( true ) {
    if (pBox->vRootLits->nSize <= i) {
      iVar1 = p->vCos->nSize;
      if (iVar1 <= p_01->nSize) {
        p_01->nSize = iVar1;
        printf("Added %d adders for replace CLAs.  ",uVar5);
        return p_01;
      }
      __assert_fail("Vec_IntSize(vRes) >= Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x17d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
    }
    pVVar4 = Vec_WecEntry(pBox->vRootLits,i);
    In[2] = 0;
    In[0] = 0;
    In[1] = 0;
    uVar3 = pVVar4->nSize;
    if ((int)uVar3 < 1) break;
    if (3 < uVar3) {
      __assert_fail("Vec_IntSize(vLevel) <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                    ,0x16d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
    }
    if (uVar3 == 1) {
      iVar1 = Vec_IntEntry(pVVar4,0);
      Vec_IntPush(p_01,iVar1);
      i = i + 1;
    }
    else {
      for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
        iVar1 = Vec_IntEntry(pVVar4,(int)lVar6);
        In[lVar6] = iVar1;
        uVar3 = pVVar4->nSize;
      }
      Acec_InsertFadd(p,In,Out);
      Vec_IntPush(p_01,Out[0]);
      i = i + 1;
      p_00 = pBox->vRootLits;
      iVar1 = p_00->nSize;
      if (i < iVar1) {
        pVVar4 = Vec_WecEntry(p_00,i);
      }
      else {
        if (iVar1 == p_00->nCap) {
          uVar7 = (ulong)(uint)(iVar1 * 2);
          if (iVar1 < 0x10) {
            uVar7 = 0x10;
          }
          iVar2 = (int)uVar7;
          if (iVar1 < iVar2) {
            if (p_00->pArray == (Vec_Int_t *)0x0) {
              pVVar4 = (Vec_Int_t *)malloc(uVar7 << 4);
            }
            else {
              pVVar4 = (Vec_Int_t *)realloc(p_00->pArray,uVar7 << 4);
              iVar1 = p_00->nCap;
            }
            p_00->pArray = pVVar4;
            memset(pVVar4 + iVar1,0,(long)(iVar2 - iVar1) << 4);
            p_00->nCap = iVar2;
            iVar1 = p_00->nSize;
          }
        }
        p_00->nSize = iVar1 + 1U;
        if (iVar1 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        pVVar4 = p_00->pArray + ((ulong)(iVar1 + 1U) - 1);
      }
      Vec_IntPush(pVVar4,Out[1]);
      uVar5 = (ulong)((int)uVar5 + 1);
    }
  }
  __assert_fail("Vec_IntSize(vLevel) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                ,0x16c,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
}

Assistant:

Vec_Int_t * Acec_RewriteTop( Gia_Man_t * p, Acec_Box_t * pBox )
{
    Vec_Int_t * vRes = Vec_IntAlloc( Gia_ManCoNum(p) + 1 );
    Vec_Int_t * vLevel;
    int i, k, iStart, iLit, Driver, Count = 0;
    // determine how much to shift
    Driver = Gia_ObjFaninId0p( p, Gia_ManCo(p, 0) );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, iStart )
        if ( Abc_Lit2Var(Vec_IntEntry(vLevel,0)) == Driver )
            break;
    assert( iStart < Gia_ManCoNum(p) );
    //Vec_WecPrintLits( pBox->vRootLits );
    Vec_WecForEachLevelStart( pBox->vRootLits, vLevel, i, iStart )
    {
        int In[3] = {0}, Out[2];
        assert( Vec_IntSize(vLevel) > 0 );
        assert( Vec_IntSize(vLevel) <= 3 );
        if ( Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntPush( vRes, Vec_IntEntry(vLevel, 0) );
            continue;
        }
        Vec_IntForEachEntry( vLevel, iLit, k )
            In[k] = iLit;
        Acec_InsertFadd( p, In, Out );
        Vec_IntPush( vRes, Out[0] );
        if ( i+1 < Vec_WecSize(pBox->vRootLits) )
            Vec_IntPush( Vec_WecEntry(pBox->vRootLits, i+1), Out[1] );
        else
            Vec_IntPush( Vec_WecPushLevel(pBox->vRootLits), Out[1] );
        Count++;
    }
    assert( Vec_IntSize(vRes) >= Gia_ManCoNum(p) );
    Vec_IntShrink( vRes, Gia_ManCoNum(p) );
    printf( "Added %d adders for replace CLAs.  ", Count );
    return vRes;
}